

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O0

string * testing::internal::CapturedStream::ReadEntireFile_abi_cxx11_(FILE *file)

{
  char *pcVar1;
  ulong uVar2;
  FILE *in_RSI;
  string *in_RDI;
  size_t bytes_read;
  size_t bytes_last_read;
  char *buffer;
  size_t file_size;
  string *content;
  bool local_59;
  allocator local_32;
  undefined1 local_31;
  ulong local_30;
  size_t local_28;
  char *local_20;
  size_t local_18;
  FILE *local_10;
  
  local_10 = in_RSI;
  local_18 = GetFileSize((FILE *)0x15f78b);
  local_20 = (char *)operator_new__(local_18);
  local_28 = 0;
  local_30 = 0;
  fseek(local_10,0,0);
  do {
    local_28 = fread(local_20 + local_30,1,local_18 - local_30,local_10);
    pcVar1 = local_20;
    uVar2 = local_28 + local_30;
    local_59 = local_28 != 0 && uVar2 < local_18;
    local_30 = uVar2;
  } while (local_59);
  local_31 = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)in_RDI,pcVar1,uVar2,&local_32);
  std::allocator<char>::~allocator((allocator<char> *)&local_32);
  if (local_20 != (char *)0x0) {
    operator_delete__(local_20);
  }
  return in_RDI;
}

Assistant:

std::string CapturedStream::ReadEntireFile(FILE* file) {
  const size_t file_size = GetFileSize(file);
  char* const buffer = new char[file_size];

  size_t bytes_last_read = 0;  // # of bytes read in the last fread()
  size_t bytes_read = 0;       // # of bytes read so far

  fseek(file, 0, SEEK_SET);

  // Keeps reading the file until we cannot read further or the
  // pre-determined file size is reached.
  do {
    bytes_last_read = fread(buffer+bytes_read, 1, file_size-bytes_read, file);
    bytes_read += bytes_last_read;
  } while (bytes_last_read > 0 && bytes_read < file_size);

  const std::string content(buffer, bytes_read);
  delete[] buffer;

  return content;
}